

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O3

void embree::avx2::
     BVHNIntersector1<4,_1048576,_false,_embree::avx2::ArrayIntersector1<embree::avx2::QuadMiIntersector1Pluecker<4,_true>_>_>
     ::intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  ulong uVar1;
  ulong uVar2;
  long lVar3;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar4;
  uint uVar5;
  float **ppfVar6;
  float *pfVar7;
  float *pfVar8;
  float *pfVar9;
  float *pfVar10;
  Geometry *pGVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 (*pauVar40) [16];
  uint uVar41;
  undefined1 (*pauVar42) [16];
  long lVar43;
  ulong uVar44;
  RTCRayQueryContext *pRVar45;
  byte bVar46;
  undefined4 uVar47;
  uint uVar48;
  ulong *puVar49;
  ulong uVar51;
  undefined4 uVar52;
  ulong uVar53;
  long lVar54;
  ulong uVar55;
  vint4 bi_1;
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [64];
  vint4 ai_1;
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [16];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  vint4 bi_2;
  undefined1 auVar72 [16];
  undefined1 auVar76 [32];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  vint4 bi;
  undefined1 auVar84 [16];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  float fVar90;
  float fVar91;
  float fVar103;
  float fVar104;
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  float fVar105;
  float fVar106;
  float fVar107;
  float fVar108;
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  float fVar109;
  float fVar114;
  float fVar115;
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  float fVar116;
  float fVar117;
  float fVar118;
  float fVar119;
  undefined1 auVar113 [32];
  undefined1 auVar120 [16];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  vint4 ai;
  undefined1 auVar123 [16];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [64];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [64];
  undefined1 auVar137 [64];
  undefined1 auVar138 [64];
  undefined1 auVar139 [32];
  undefined1 auVar140 [64];
  float fVar141;
  float fVar143;
  float fVar144;
  float fVar145;
  float fVar146;
  float fVar147;
  float fVar148;
  undefined1 auVar142 [64];
  undefined1 auVar149 [32];
  undefined1 auVar150 [64];
  RTCFilterFunctionNArguments args;
  HitK<1> h;
  vbool<8> valid;
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  int local_1504;
  undefined1 local_1500 [48];
  RTCFilterFunctionNArguments local_14d0;
  undefined1 local_14a0 [32];
  undefined1 local_1480 [8];
  float fStack_1478;
  float fStack_1474;
  float fStack_1470;
  float fStack_146c;
  float fStack_1468;
  float fStack_1464;
  long local_1458;
  Scene *local_1450;
  ulong local_1448;
  undefined1 local_1440 [32];
  float local_1410;
  float local_140c;
  float local_1408;
  undefined4 local_1404;
  undefined4 local_1400;
  undefined4 local_13fc;
  uint local_13f8;
  uint local_13f4;
  uint local_13f0;
  undefined1 local_13e0 [32];
  undefined1 local_13c0 [32];
  undefined1 local_1390 [16];
  undefined1 local_1380 [16];
  undefined1 local_1370 [16];
  undefined1 local_1360 [16];
  undefined1 local_1350 [16];
  undefined1 local_1340 [16];
  undefined1 local_1330 [16];
  undefined8 local_1320;
  undefined8 uStack_1318;
  undefined8 uStack_1310;
  undefined8 uStack_1308;
  undefined1 local_1300 [16];
  undefined4 uStack_12f0;
  undefined4 uStack_12ec;
  undefined4 uStack_12e8;
  undefined4 uStack_12e4;
  undefined1 local_12e0 [32];
  undefined1 local_12c0 [32];
  undefined1 local_12a0 [32];
  undefined1 local_1280 [32];
  undefined1 local_1260 [32];
  undefined1 local_1240 [32];
  undefined1 local_1220 [32];
  undefined1 local_1200 [32];
  undefined1 local_11e0 [32];
  float local_11c0 [4];
  float fStack_11b0;
  float fStack_11ac;
  float fStack_11a8;
  undefined4 uStack_11a4;
  float local_11a0 [4];
  float fStack_1190;
  float fStack_118c;
  float fStack_1188;
  undefined4 uStack_1184;
  float local_1180 [4];
  float fStack_1170;
  float fStack_116c;
  float fStack_1168;
  undefined4 uStack_1164;
  undefined1 local_1160 [32];
  undefined1 local_1140 [8];
  float fStack_1138;
  float fStack_1134;
  float fStack_1130;
  float fStack_112c;
  float fStack_1128;
  undefined4 uStack_1124;
  undefined1 local_1120 [32];
  undefined4 local_1100;
  undefined4 uStack_10fc;
  undefined4 uStack_10f8;
  undefined4 uStack_10f4;
  undefined4 uStack_10f0;
  undefined4 uStack_10ec;
  undefined4 uStack_10e8;
  undefined4 uStack_10e4;
  undefined1 local_10e0 [32];
  undefined1 local_10c0 [32];
  undefined1 local_10a0 [32];
  undefined1 local_1080 [32];
  undefined1 local_1060 [32];
  undefined1 local_1040 [32];
  undefined1 local_1020 [32];
  undefined1 local_1000 [32];
  undefined1 local_fe0 [32];
  undefined8 local_fc0;
  undefined8 uStack_fb8;
  undefined8 uStack_fb0;
  undefined8 uStack_fa8;
  long local_fa0;
  undefined4 uStack_f98;
  undefined1 local_f90 [3936];
  ulong uVar50;
  float fVar71;
  float fVar81;
  float fVar82;
  float fVar83;
  
  local_fa0 = *(long *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_fa0 != 8) {
    pauVar42 = (undefined1 (*) [16])local_f90;
    auVar61 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[3]))
    ;
    auVar63 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).tfar));
    aVar4 = (ray->super_RayK<1>).dir.field_0;
    auVar98._8_4_ = 0x7fffffff;
    auVar98._0_8_ = 0x7fffffff7fffffff;
    auVar98._12_4_ = 0x7fffffff;
    auVar98 = vandps_avx((undefined1  [16])aVar4,auVar98);
    auVar92._8_4_ = 0x219392ef;
    auVar92._0_8_ = 0x219392ef219392ef;
    auVar92._12_4_ = 0x219392ef;
    auVar98 = vcmpps_avx(auVar98,auVar92,1);
    auVar98 = vblendvps_avx((undefined1  [16])aVar4,auVar92,auVar98);
    uStack_f98 = 0;
    auVar92 = vrcpps_avx(auVar98);
    auVar93._8_4_ = 0x3f800000;
    auVar93._0_8_ = 0x3f8000003f800000;
    auVar93._12_4_ = 0x3f800000;
    auVar98 = vfnmadd231ps_fma(auVar93,auVar92,auVar98);
    auVar93 = vfmadd132ps_fma(auVar98,auVar92,auVar92);
    fVar90 = auVar93._0_4_;
    local_1330._4_4_ = fVar90;
    local_1330._0_4_ = fVar90;
    local_1330._8_4_ = fVar90;
    local_1330._12_4_ = fVar90;
    auVar133 = ZEXT1664(local_1330);
    auVar98 = vmovshdup_avx(auVar93);
    local_1340 = vshufps_avx(auVar93,auVar93,0x55);
    auVar136 = ZEXT1664(local_1340);
    auVar92 = vshufpd_avx(auVar93,auVar93,1);
    local_1350 = vshufps_avx(auVar93,auVar93,0xaa);
    auVar137 = ZEXT1664(local_1350);
    auVar94._0_4_ = fVar90 * (ray->super_RayK<1>).org.field_0.m128[0];
    auVar94._4_4_ = auVar93._4_4_ * (ray->super_RayK<1>).org.field_0.m128[1];
    auVar94._8_4_ = auVar93._8_4_ * (ray->super_RayK<1>).org.field_0.m128[2];
    auVar94._12_4_ = auVar93._12_4_ * (ray->super_RayK<1>).org.field_0.m128[3];
    auVar93 = vshufps_avx(auVar94,auVar94,0x55);
    auVar62 = vshufps_avx(auVar94,auVar94,0xaa);
    uVar55 = (ulong)(fVar90 < 0.0) * 4;
    uVar1 = (ulong)(auVar98._0_4_ < 0.0) * 4 + 8;
    uVar2 = (ulong)(auVar92._0_4_ < 0.0) * 4 + 0x10;
    uVar47 = auVar63._0_4_;
    auVar60 = ZEXT1664(CONCAT412(uVar47,CONCAT48(uVar47,CONCAT44(uVar47,uVar47))));
    local_1448 = uVar55 ^ 4;
    uVar51 = CONCAT44(auVar94._0_4_,auVar94._0_4_);
    local_1360._0_8_ = uVar51 ^ 0x8000000080000000;
    local_1360._8_4_ = -auVar94._0_4_;
    local_1360._12_4_ = -auVar94._0_4_;
    auVar138 = ZEXT1664(local_1360);
    local_1370._0_8_ = auVar93._0_8_ ^ 0x8000000080000000;
    local_1370._8_4_ = auVar93._8_4_ ^ 0x80000000;
    local_1370._12_4_ = auVar93._12_4_ ^ 0x80000000;
    auVar140 = ZEXT1664(local_1370);
    local_1380._0_8_ = auVar62._0_8_ ^ 0x8000000080000000;
    local_1380._8_4_ = auVar62._8_4_ ^ 0x80000000;
    local_1380._12_4_ = auVar62._12_4_ ^ 0x80000000;
    auVar142 = ZEXT1664(local_1380);
    uVar47 = auVar61._0_4_;
    local_1390._4_4_ = uVar47;
    local_1390._0_4_ = uVar47;
    local_1390._8_4_ = uVar47;
    local_1390._12_4_ = uVar47;
    auVar150 = ZEXT1664(local_1390);
    local_1120._16_16_ = mm_lookupmask_ps._240_16_;
    local_1120._0_16_ = mm_lookupmask_ps._0_16_;
    auVar76._8_4_ = 0x3f800000;
    auVar76._0_8_ = 0x3f8000003f800000;
    auVar76._12_4_ = 0x3f800000;
    auVar76._16_4_ = 0x3f800000;
    auVar76._20_4_ = 0x3f800000;
    auVar76._24_4_ = 0x3f800000;
    auVar76._28_4_ = 0x3f800000;
    auVar58._8_4_ = 0xbf800000;
    auVar58._0_8_ = 0xbf800000bf800000;
    auVar58._12_4_ = 0xbf800000;
    auVar58._16_4_ = 0xbf800000;
    auVar58._20_4_ = 0xbf800000;
    auVar58._24_4_ = 0xbf800000;
    auVar58._28_4_ = 0xbf800000;
    _local_1140 = vblendvps_avx(auVar76,auVar58,local_1120);
LAB_01937065:
    do {
      pauVar40 = pauVar42 + -1;
      pauVar42 = pauVar42 + -1;
      if (*(float *)(*pauVar40 + 8) <= (ray->super_RayK<1>).tfar) {
        uVar51 = *(ulong *)*pauVar42;
        while ((uVar51 & 8) == 0) {
          uVar44 = uVar51 & 0xfffffffffffffff0;
          puVar49 = (ulong *)(uVar44 + 0x20);
          if (uVar44 == 0) {
            puVar49 = (ulong *)0x0;
          }
          uVar47 = (undefined4)puVar49[3];
          auVar72._4_4_ = uVar47;
          auVar72._0_4_ = uVar47;
          auVar72._8_4_ = uVar47;
          auVar72._12_4_ = uVar47;
          uVar47 = *(undefined4 *)((long)puVar49 + 0x24);
          auVar84._4_4_ = uVar47;
          auVar84._0_4_ = uVar47;
          auVar84._8_4_ = uVar47;
          auVar84._12_4_ = uVar47;
          auVar61._8_8_ = 0;
          auVar61._0_8_ = *(ulong *)((long)puVar49 + uVar55);
          auVar98 = vpmovzxbd_avx(auVar61);
          auVar98 = vcvtdq2ps_avx(auVar98);
          auVar63 = vfmadd213ps_fma(auVar98,auVar84,auVar72);
          auVar62._8_8_ = 0;
          auVar62._0_8_ = *(ulong *)((long)puVar49 + local_1448);
          auVar98 = vpmovzxbd_avx(auVar62);
          auVar98 = vcvtdq2ps_avx(auVar98);
          auVar92 = vfmadd213ps_fma(auVar98,auVar84,auVar72);
          uVar47 = *(undefined4 *)((long)puVar49 + 0x1c);
          auVar95._4_4_ = uVar47;
          auVar95._0_4_ = uVar47;
          auVar95._8_4_ = uVar47;
          auVar95._12_4_ = uVar47;
          uVar47 = (undefined4)puVar49[5];
          auVar110._4_4_ = uVar47;
          auVar110._0_4_ = uVar47;
          auVar110._8_4_ = uVar47;
          auVar110._12_4_ = uVar47;
          auVar73._8_8_ = 0;
          auVar73._0_8_ = *(ulong *)((long)puVar49 + uVar1);
          auVar98 = vpmovzxbd_avx(auVar73);
          auVar98 = vcvtdq2ps_avx(auVar98);
          auVar93 = vfmadd213ps_fma(auVar98,auVar110,auVar95);
          auVar74._8_8_ = 0;
          auVar74._0_8_ = *(ulong *)((long)puVar49 + (uVar1 ^ 4));
          auVar98 = vpmovzxbd_avx(auVar74);
          auVar98 = vcvtdq2ps_avx(auVar98);
          auVar62 = vfmadd213ps_fma(auVar98,auVar110,auVar95);
          uVar47 = (undefined4)puVar49[4];
          auVar96._4_4_ = uVar47;
          auVar96._0_4_ = uVar47;
          auVar96._8_4_ = uVar47;
          auVar96._12_4_ = uVar47;
          uVar47 = *(undefined4 *)((long)puVar49 + 0x2c);
          auVar111._4_4_ = uVar47;
          auVar111._0_4_ = uVar47;
          auVar111._8_4_ = uVar47;
          auVar111._12_4_ = uVar47;
          auVar120._8_8_ = 0;
          auVar120._0_8_ = *(ulong *)((long)puVar49 + uVar2);
          auVar98 = vpmovzxbd_avx(auVar120);
          auVar98 = vcvtdq2ps_avx(auVar98);
          auVar94 = vfmadd213ps_fma(auVar98,auVar111,auVar96);
          auVar123._8_8_ = 0;
          auVar123._0_8_ = *(ulong *)((long)puVar49 + (uVar2 ^ 4));
          auVar98 = vpmovzxbd_avx(auVar123);
          auVar98 = vcvtdq2ps_avx(auVar98);
          auVar72 = vfmadd213ps_fma(auVar98,auVar111,auVar96);
          auVar97._8_8_ = 0;
          auVar97._0_8_ = *puVar49;
          auVar112._8_8_ = 0;
          auVar112._0_8_ = *(ulong *)((long)puVar49 + 4);
          auVar61 = vpminub_avx(auVar97,auVar112);
          auVar98 = vpcmpeqb_avx(auVar97,auVar61);
          auVar61 = vpcmpeqd_avx(auVar61,auVar61);
          auVar98 = vpmovzxbd_avx(auVar98 ^ auVar61);
          auVar98 = vpslld_avx(auVar98 ^ auVar61,0x1f);
          uVar52 = vmovmskps_avx(auVar98);
          auVar98 = vfmadd213ps_fma(auVar63,auVar133._0_16_,auVar138._0_16_);
          auVar61 = vfmadd213ps_fma(auVar93,auVar136._0_16_,auVar140._0_16_);
          auVar98 = vpmaxsd_avx(auVar98,auVar61);
          auVar61 = vfmadd213ps_fma(auVar94,auVar137._0_16_,auVar142._0_16_);
          auVar61 = vpmaxsd_avx(auVar61,auVar150._0_16_);
          local_1300 = vpmaxsd_avx(auVar98,auVar61);
          auVar98 = vfmadd213ps_fma(auVar92,auVar133._0_16_,auVar138._0_16_);
          auVar61 = vfmadd213ps_fma(auVar62,auVar136._0_16_,auVar140._0_16_);
          auVar98 = vpminsd_avx(auVar98,auVar61);
          auVar61 = vfmadd213ps_fma(auVar72,auVar137._0_16_,auVar142._0_16_);
          auVar61 = vpminsd_avx(auVar61,auVar60._0_16_);
          auVar98 = vpminsd_avx(auVar98,auVar61);
          auVar98 = vpcmpgtd_avx(local_1300,auVar98);
          uVar47 = vmovmskps_avx(auVar98);
          bVar46 = ~(byte)uVar47 & (byte)uVar52;
          if (bVar46 == 0) {
            if (pauVar42 == (undefined1 (*) [16])&local_fa0) {
              return;
            }
            goto LAB_01937065;
          }
          lVar54 = 0;
          for (uVar51 = (ulong)bVar46; (uVar51 & 1) == 0; uVar51 = uVar51 >> 1 | 0x8000000000000000)
          {
            lVar54 = lVar54 + 1;
          }
          uVar51 = *(ulong *)(uVar44 + lVar54 * 8);
          uVar48 = bVar46 - 1 & (uint)bVar46;
          uVar50 = (ulong)uVar48;
          if (uVar48 != 0) {
            uVar41 = *(uint *)(local_1300 + lVar54 * 4);
            lVar54 = 0;
            for (; (uVar50 & 1) == 0; uVar50 = uVar50 >> 1 | 0x8000000000000000) {
              lVar54 = lVar54 + 1;
            }
            uVar48 = uVar48 - 1 & uVar48;
            uVar53 = (ulong)uVar48;
            uVar50 = *(ulong *)(uVar44 + lVar54 * 8);
            uVar5 = *(uint *)(local_1300 + lVar54 * 4);
            if (uVar48 == 0) {
              if (uVar41 < uVar5) {
                *(ulong *)*pauVar42 = uVar50;
                *(uint *)(*pauVar42 + 8) = uVar5;
                pauVar42 = pauVar42 + 1;
              }
              else {
                *(ulong *)*pauVar42 = uVar51;
                *(uint *)(*pauVar42 + 8) = uVar41;
                pauVar42 = pauVar42 + 1;
                uVar51 = uVar50;
              }
            }
            else {
              auVar63._8_8_ = 0;
              auVar63._0_8_ = uVar51;
              auVar98 = vpunpcklqdq_avx(auVar63,ZEXT416(uVar41));
              auVar66._8_8_ = 0;
              auVar66._0_8_ = uVar50;
              auVar61 = vpunpcklqdq_avx(auVar66,ZEXT416(uVar5));
              lVar54 = 0;
              for (; (uVar53 & 1) == 0; uVar53 = uVar53 >> 1 | 0x8000000000000000) {
                lVar54 = lVar54 + 1;
              }
              uVar48 = uVar48 - 1 & uVar48;
              uVar51 = (ulong)uVar48;
              auVar75._8_8_ = 0;
              auVar75._0_8_ = *(ulong *)(uVar44 + lVar54 * 8);
              auVar92 = vpunpcklqdq_avx(auVar75,ZEXT416(*(uint *)(local_1300 + lVar54 * 4)));
              auVar63 = vpcmpgtd_avx(auVar61,auVar98);
              if (uVar48 == 0) {
                auVar93 = vpshufd_avx(auVar63,0xaa);
                auVar63 = vblendvps_avx(auVar61,auVar98,auVar93);
                auVar98 = vblendvps_avx(auVar98,auVar61,auVar93);
                auVar61 = vpcmpgtd_avx(auVar92,auVar63);
                auVar93 = vpshufd_avx(auVar61,0xaa);
                auVar61 = vblendvps_avx(auVar92,auVar63,auVar93);
                auVar63 = vblendvps_avx(auVar63,auVar92,auVar93);
                auVar92 = vpcmpgtd_avx(auVar63,auVar98);
                auVar93 = vpshufd_avx(auVar92,0xaa);
                auVar92 = vblendvps_avx(auVar63,auVar98,auVar93);
                auVar98 = vblendvps_avx(auVar98,auVar63,auVar93);
                *pauVar42 = auVar98;
                pauVar42[1] = auVar92;
                uVar51 = auVar61._0_8_;
                pauVar42 = pauVar42 + 2;
              }
              else {
                lVar54 = 0;
                for (; (uVar51 & 1) == 0; uVar51 = uVar51 >> 1 | 0x8000000000000000) {
                  lVar54 = lVar54 + 1;
                }
                auVar99._8_8_ = 0;
                auVar99._0_8_ = *(ulong *)(uVar44 + lVar54 * 8);
                auVar62 = vpunpcklqdq_avx(auVar99,ZEXT416(*(uint *)(local_1300 + lVar54 * 4)));
                auVar93 = vpshufd_avx(auVar63,0xaa);
                auVar63 = vblendvps_avx(auVar61,auVar98,auVar93);
                auVar98 = vblendvps_avx(auVar98,auVar61,auVar93);
                auVar61 = vpcmpgtd_avx(auVar62,auVar92);
                auVar93 = vpshufd_avx(auVar61,0xaa);
                auVar61 = vblendvps_avx(auVar62,auVar92,auVar93);
                auVar92 = vblendvps_avx(auVar92,auVar62,auVar93);
                auVar93 = vpcmpgtd_avx(auVar92,auVar98);
                auVar62 = vpshufd_avx(auVar93,0xaa);
                auVar93 = vblendvps_avx(auVar92,auVar98,auVar62);
                auVar98 = vblendvps_avx(auVar98,auVar92,auVar62);
                auVar92 = vpcmpgtd_avx(auVar61,auVar63);
                auVar62 = vpshufd_avx(auVar92,0xaa);
                auVar92 = vblendvps_avx(auVar61,auVar63,auVar62);
                auVar61 = vblendvps_avx(auVar63,auVar61,auVar62);
                auVar63 = vpcmpgtd_avx(auVar93,auVar61);
                auVar62 = vpshufd_avx(auVar63,0xaa);
                auVar63 = vblendvps_avx(auVar93,auVar61,auVar62);
                auVar61 = vblendvps_avx(auVar61,auVar93,auVar62);
                *pauVar42 = auVar98;
                pauVar42[1] = auVar61;
                pauVar42[2] = auVar63;
                uVar51 = auVar92._0_8_;
                pauVar42 = pauVar42 + 3;
              }
            }
          }
        }
        local_1458 = (ulong)((uint)uVar51 & 0xf) - 8;
        if (local_1458 != 0) {
          uVar51 = uVar51 & 0xfffffffffffffff0;
          lVar54 = 0;
          do {
            lVar43 = lVar54 * 0x60;
            local_1450 = context->scene;
            ppfVar6 = (context->scene->vertices).items;
            pfVar7 = ppfVar6[*(uint *)(uVar51 + 0x40 + lVar43)];
            auVar67._16_16_ = *(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar51 + 0x20 + lVar43));
            auVar67._0_16_ = *(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar51 + lVar43));
            pfVar8 = ppfVar6[*(uint *)(uVar51 + 0x48 + lVar43)];
            auVar77._16_16_ = *(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar51 + 0x28 + lVar43));
            auVar77._0_16_ = *(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar51 + 8 + lVar43));
            pfVar9 = ppfVar6[*(uint *)(uVar51 + 0x44 + lVar43)];
            auVar100._16_16_ = *(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar51 + 0x24 + lVar43));
            auVar100._0_16_ = *(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar51 + 4 + lVar43));
            pfVar10 = ppfVar6[*(uint *)(uVar51 + 0x4c + lVar43)];
            auVar130._16_16_ = *(undefined1 (*) [16])(pfVar10 + *(uint *)(uVar51 + 0x2c + lVar43));
            auVar130._0_16_ = *(undefined1 (*) [16])(pfVar10 + *(uint *)(uVar51 + 0xc + lVar43));
            lVar3 = uVar51 + 0x40 + lVar43;
            local_fc0 = *(undefined8 *)(lVar3 + 0x10);
            uStack_fb8 = *(undefined8 *)(lVar3 + 0x18);
            uStack_fb0 = local_fc0;
            uStack_fa8 = uStack_fb8;
            lVar3 = uVar51 + 0x50 + lVar43;
            local_1320 = *(undefined8 *)(lVar3 + 0x10);
            uStack_1318 = *(undefined8 *)(lVar3 + 0x18);
            auVar63 = vunpcklps_avx(*(undefined1 (*) [16])
                                     (pfVar7 + *(uint *)(uVar51 + 0x10 + lVar43)),
                                    *(undefined1 (*) [16])
                                     (pfVar8 + *(uint *)(uVar51 + 0x18 + lVar43)));
            auVar98 = vunpckhps_avx(*(undefined1 (*) [16])
                                     (pfVar7 + *(uint *)(uVar51 + 0x10 + lVar43)),
                                    *(undefined1 (*) [16])
                                     (pfVar8 + *(uint *)(uVar51 + 0x18 + lVar43)));
            auVar92 = vunpcklps_avx(*(undefined1 (*) [16])
                                     (pfVar9 + *(uint *)(uVar51 + 0x14 + lVar43)),
                                    *(undefined1 (*) [16])
                                     (pfVar10 + *(uint *)(uVar51 + 0x1c + lVar43)));
            auVar61 = vunpckhps_avx(*(undefined1 (*) [16])
                                     (pfVar9 + *(uint *)(uVar51 + 0x14 + lVar43)),
                                    *(undefined1 (*) [16])
                                     (pfVar10 + *(uint *)(uVar51 + 0x1c + lVar43)));
            auVar93 = vunpcklps_avx(auVar98,auVar61);
            auVar62 = vunpcklps_avx(auVar63,auVar92);
            auVar98 = vunpckhps_avx(auVar63,auVar92);
            auVar92 = vunpcklps_avx(*(undefined1 (*) [16])
                                     (pfVar7 + *(uint *)(uVar51 + 0x30 + lVar43)),
                                    *(undefined1 (*) [16])
                                     (pfVar8 + *(uint *)(uVar51 + 0x38 + lVar43)));
            auVar61 = vunpckhps_avx(*(undefined1 (*) [16])
                                     (pfVar7 + *(uint *)(uVar51 + 0x30 + lVar43)),
                                    *(undefined1 (*) [16])
                                     (pfVar8 + *(uint *)(uVar51 + 0x38 + lVar43)));
            auVar94 = vunpcklps_avx(*(undefined1 (*) [16])
                                     (pfVar9 + *(uint *)(uVar51 + 0x34 + lVar43)),
                                    *(undefined1 (*) [16])
                                     (pfVar10 + *(uint *)(uVar51 + 0x3c + lVar43)));
            auVar63 = vunpckhps_avx(*(undefined1 (*) [16])
                                     (pfVar9 + *(uint *)(uVar51 + 0x34 + lVar43)),
                                    *(undefined1 (*) [16])
                                     (pfVar10 + *(uint *)(uVar51 + 0x3c + lVar43)));
            auVar63 = vunpcklps_avx(auVar61,auVar63);
            auVar72 = vunpcklps_avx(auVar92,auVar94);
            auVar61 = vunpckhps_avx(auVar92,auVar94);
            uStack_1310 = local_1320;
            uStack_1308 = uStack_1318;
            auVar58 = vunpcklps_avx(auVar100,auVar130);
            auVar76 = vunpcklps_avx(auVar67,auVar77);
            auVar23 = vunpcklps_avx(auVar76,auVar58);
            auVar58 = vunpckhps_avx(auVar76,auVar58);
            auVar76 = vunpckhps_avx(auVar100,auVar130);
            auVar80 = vunpckhps_avx(auVar67,auVar77);
            auVar76 = vunpcklps_avx(auVar80,auVar76);
            auVar134._16_16_ = auVar62;
            auVar134._0_16_ = auVar62;
            auVar101._16_16_ = auVar98;
            auVar101._0_16_ = auVar98;
            auVar121._16_16_ = auVar93;
            auVar121._0_16_ = auVar93;
            auVar149._16_16_ = auVar72;
            auVar149._0_16_ = auVar72;
            auVar85._16_16_ = auVar61;
            auVar85._0_16_ = auVar61;
            uVar47 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
            auVar124._4_4_ = uVar47;
            auVar124._0_4_ = uVar47;
            auVar124._8_4_ = uVar47;
            auVar124._12_4_ = uVar47;
            auVar124._16_4_ = uVar47;
            auVar124._20_4_ = uVar47;
            auVar124._24_4_ = uVar47;
            auVar124._28_4_ = uVar47;
            uVar47 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
            auVar131._4_4_ = uVar47;
            auVar131._0_4_ = uVar47;
            auVar131._8_4_ = uVar47;
            auVar131._12_4_ = uVar47;
            auVar131._16_4_ = uVar47;
            auVar131._20_4_ = uVar47;
            auVar131._24_4_ = uVar47;
            auVar131._28_4_ = uVar47;
            auVar56._16_16_ = auVar63;
            auVar56._0_16_ = auVar63;
            uVar47 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
            auVar139._4_4_ = uVar47;
            auVar139._0_4_ = uVar47;
            auVar139._8_4_ = uVar47;
            auVar139._12_4_ = uVar47;
            auVar139._16_4_ = uVar47;
            auVar139._20_4_ = uVar47;
            auVar139._24_4_ = uVar47;
            auVar139._28_4_ = uVar47;
            local_1440 = vsubps_avx(auVar23,auVar124);
            local_13c0 = vsubps_avx(auVar58,auVar131);
            local_fe0 = vsubps_avx(auVar76,auVar139);
            auVar58 = vsubps_avx(auVar134,auVar124);
            auVar76 = vsubps_avx(auVar101,auVar131);
            auVar80 = vsubps_avx(auVar121,auVar139);
            auVar23 = vsubps_avx(auVar149,auVar124);
            auVar67 = vsubps_avx(auVar85,auVar131);
            auVar21 = vsubps_avx(auVar56,auVar139);
            local_1000 = vsubps_avx(auVar23,local_1440);
            local_1040 = vsubps_avx(auVar67,local_13c0);
            local_1020 = vsubps_avx(auVar21,local_fe0);
            auVar57._0_4_ = auVar23._0_4_ + local_1440._0_4_;
            auVar57._4_4_ = auVar23._4_4_ + local_1440._4_4_;
            auVar57._8_4_ = auVar23._8_4_ + local_1440._8_4_;
            auVar57._12_4_ = auVar23._12_4_ + local_1440._12_4_;
            auVar57._16_4_ = auVar23._16_4_ + local_1440._16_4_;
            auVar57._20_4_ = auVar23._20_4_ + local_1440._20_4_;
            auVar57._24_4_ = auVar23._24_4_ + local_1440._24_4_;
            auVar57._28_4_ = auVar23._28_4_ + local_1440._28_4_;
            auVar68._0_4_ = local_13c0._0_4_ + auVar67._0_4_;
            auVar68._4_4_ = local_13c0._4_4_ + auVar67._4_4_;
            auVar68._8_4_ = local_13c0._8_4_ + auVar67._8_4_;
            auVar68._12_4_ = local_13c0._12_4_ + auVar67._12_4_;
            auVar68._16_4_ = local_13c0._16_4_ + auVar67._16_4_;
            auVar68._20_4_ = local_13c0._20_4_ + auVar67._20_4_;
            auVar68._24_4_ = local_13c0._24_4_ + auVar67._24_4_;
            auVar68._28_4_ = local_13c0._28_4_ + auVar67._28_4_;
            fVar90 = local_fe0._0_4_;
            auVar86._0_4_ = auVar21._0_4_ + fVar90;
            fVar12 = local_fe0._4_4_;
            auVar86._4_4_ = auVar21._4_4_ + fVar12;
            fVar13 = local_fe0._8_4_;
            auVar86._8_4_ = auVar21._8_4_ + fVar13;
            fVar14 = local_fe0._12_4_;
            auVar86._12_4_ = auVar21._12_4_ + fVar14;
            fVar15 = local_fe0._16_4_;
            auVar86._16_4_ = auVar21._16_4_ + fVar15;
            fVar16 = local_fe0._20_4_;
            auVar86._20_4_ = auVar21._20_4_ + fVar16;
            fVar17 = local_fe0._24_4_;
            auVar86._24_4_ = auVar21._24_4_ + fVar17;
            fVar71 = local_fe0._28_4_;
            auVar86._28_4_ = auVar21._28_4_ + fVar71;
            auVar22._4_4_ = local_1020._4_4_ * auVar68._4_4_;
            auVar22._0_4_ = local_1020._0_4_ * auVar68._0_4_;
            auVar22._8_4_ = local_1020._8_4_ * auVar68._8_4_;
            auVar22._12_4_ = local_1020._12_4_ * auVar68._12_4_;
            auVar22._16_4_ = local_1020._16_4_ * auVar68._16_4_;
            auVar22._20_4_ = local_1020._20_4_ * auVar68._20_4_;
            auVar22._24_4_ = local_1020._24_4_ * auVar68._24_4_;
            auVar22._28_4_ = uVar47;
            auVar61 = vfmsub231ps_fma(auVar22,local_1040,auVar86);
            auVar24._4_4_ = local_1000._4_4_ * auVar86._4_4_;
            auVar24._0_4_ = local_1000._0_4_ * auVar86._0_4_;
            auVar24._8_4_ = local_1000._8_4_ * auVar86._8_4_;
            auVar24._12_4_ = local_1000._12_4_ * auVar86._12_4_;
            auVar24._16_4_ = local_1000._16_4_ * auVar86._16_4_;
            auVar24._20_4_ = local_1000._20_4_ * auVar86._20_4_;
            auVar24._24_4_ = local_1000._24_4_ * auVar86._24_4_;
            auVar24._28_4_ = auVar86._28_4_;
            auVar98 = vfmsub231ps_fma(auVar24,local_1020,auVar57);
            auVar25._4_4_ = auVar57._4_4_ * local_1040._4_4_;
            auVar25._0_4_ = auVar57._0_4_ * local_1040._0_4_;
            auVar25._8_4_ = auVar57._8_4_ * local_1040._8_4_;
            auVar25._12_4_ = auVar57._12_4_ * local_1040._12_4_;
            auVar25._16_4_ = auVar57._16_4_ * local_1040._16_4_;
            auVar25._20_4_ = auVar57._20_4_ * local_1040._20_4_;
            auVar25._24_4_ = auVar57._24_4_ * local_1040._24_4_;
            auVar25._28_4_ = auVar57._28_4_;
            auVar63 = vfmsub231ps_fma(auVar25,local_1000,auVar68);
            uVar47 = *(undefined4 *)((long)&(ray->super_RayK<1>).dir.field_0 + 4);
            local_1500._4_4_ = uVar47;
            local_1500._0_4_ = uVar47;
            local_1500._8_4_ = uVar47;
            local_1500._12_4_ = uVar47;
            local_1500._16_4_ = uVar47;
            local_1500._20_4_ = uVar47;
            local_1500._24_4_ = uVar47;
            local_1500._28_4_ = uVar47;
            local_1480._4_4_ = (ray->super_RayK<1>).dir.field_0.m128[2];
            auVar26._4_4_ = (float)local_1480._4_4_ * auVar63._4_4_;
            auVar26._0_4_ = (float)local_1480._4_4_ * auVar63._0_4_;
            auVar26._8_4_ = (float)local_1480._4_4_ * auVar63._8_4_;
            auVar26._12_4_ = (float)local_1480._4_4_ * auVar63._12_4_;
            auVar26._16_4_ = (float)local_1480._4_4_ * 0.0;
            auVar26._20_4_ = (float)local_1480._4_4_ * 0.0;
            auVar26._24_4_ = (float)local_1480._4_4_ * 0.0;
            auVar26._28_4_ = local_1020._28_4_;
            auVar98 = vfmadd231ps_fma(auVar26,local_1500._0_32_,ZEXT1632(auVar98));
            uVar47 = *(undefined4 *)&(ray->super_RayK<1>).dir.field_0;
            auVar122._4_4_ = uVar47;
            auVar122._0_4_ = uVar47;
            auVar122._8_4_ = uVar47;
            auVar122._12_4_ = uVar47;
            auVar122._16_4_ = uVar47;
            auVar122._20_4_ = uVar47;
            auVar122._24_4_ = uVar47;
            auVar122._28_4_ = uVar47;
            local_1300 = vfmadd231ps_fma(ZEXT1632(auVar98),auVar122,ZEXT1632(auVar61));
            local_1060 = vsubps_avx(local_13c0,auVar76);
            local_1080 = vsubps_avx(local_fe0,auVar80);
            auVar69._0_4_ = local_13c0._0_4_ + auVar76._0_4_;
            auVar69._4_4_ = local_13c0._4_4_ + auVar76._4_4_;
            auVar69._8_4_ = local_13c0._8_4_ + auVar76._8_4_;
            auVar69._12_4_ = local_13c0._12_4_ + auVar76._12_4_;
            auVar69._16_4_ = local_13c0._16_4_ + auVar76._16_4_;
            auVar69._20_4_ = local_13c0._20_4_ + auVar76._20_4_;
            auVar69._24_4_ = local_13c0._24_4_ + auVar76._24_4_;
            auVar69._28_4_ = local_13c0._28_4_ + auVar76._28_4_;
            auVar87._0_4_ = auVar80._0_4_ + fVar90;
            auVar87._4_4_ = auVar80._4_4_ + fVar12;
            auVar87._8_4_ = auVar80._8_4_ + fVar13;
            auVar87._12_4_ = auVar80._12_4_ + fVar14;
            auVar87._16_4_ = auVar80._16_4_ + fVar15;
            auVar87._20_4_ = auVar80._20_4_ + fVar16;
            auVar87._24_4_ = auVar80._24_4_ + fVar17;
            auVar87._28_4_ = auVar80._28_4_ + fVar71;
            fVar81 = local_1080._0_4_;
            fVar82 = local_1080._4_4_;
            auVar27._4_4_ = auVar69._4_4_ * fVar82;
            auVar27._0_4_ = auVar69._0_4_ * fVar81;
            fVar91 = local_1080._8_4_;
            auVar27._8_4_ = auVar69._8_4_ * fVar91;
            fVar104 = local_1080._12_4_;
            auVar27._12_4_ = auVar69._12_4_ * fVar104;
            fVar106 = local_1080._16_4_;
            auVar27._16_4_ = auVar69._16_4_ * fVar106;
            fVar108 = local_1080._20_4_;
            auVar27._20_4_ = auVar69._20_4_ * fVar108;
            fVar19 = local_1080._24_4_;
            auVar27._24_4_ = auVar69._24_4_ * fVar19;
            auVar27._28_4_ = fVar71;
            auVar61 = vfmsub231ps_fma(auVar27,local_1060,auVar87);
            local_10a0 = vsubps_avx(local_1440,auVar58);
            fVar141 = local_10a0._0_4_;
            fVar143 = local_10a0._4_4_;
            auVar28._4_4_ = fVar143 * auVar87._4_4_;
            auVar28._0_4_ = fVar141 * auVar87._0_4_;
            fVar144 = local_10a0._8_4_;
            auVar28._8_4_ = fVar144 * auVar87._8_4_;
            fVar145 = local_10a0._12_4_;
            auVar28._12_4_ = fVar145 * auVar87._12_4_;
            fVar146 = local_10a0._16_4_;
            auVar28._16_4_ = fVar146 * auVar87._16_4_;
            fVar147 = local_10a0._20_4_;
            auVar28._20_4_ = fVar147 * auVar87._20_4_;
            fVar148 = local_10a0._24_4_;
            auVar28._24_4_ = fVar148 * auVar87._24_4_;
            auVar28._28_4_ = auVar87._28_4_;
            auVar125._0_4_ = local_1440._0_4_ + auVar58._0_4_;
            auVar125._4_4_ = local_1440._4_4_ + auVar58._4_4_;
            auVar125._8_4_ = local_1440._8_4_ + auVar58._8_4_;
            auVar125._12_4_ = local_1440._12_4_ + auVar58._12_4_;
            auVar125._16_4_ = local_1440._16_4_ + auVar58._16_4_;
            auVar125._20_4_ = local_1440._20_4_ + auVar58._20_4_;
            auVar125._24_4_ = local_1440._24_4_ + auVar58._24_4_;
            auVar125._28_4_ = local_1440._28_4_ + auVar58._28_4_;
            auVar98 = vfmsub231ps_fma(auVar28,local_1080,auVar125);
            fVar71 = local_1060._0_4_;
            fVar83 = local_1060._4_4_;
            auVar29._4_4_ = auVar125._4_4_ * fVar83;
            auVar29._0_4_ = auVar125._0_4_ * fVar71;
            fVar103 = local_1060._8_4_;
            auVar29._8_4_ = auVar125._8_4_ * fVar103;
            fVar105 = local_1060._12_4_;
            auVar29._12_4_ = auVar125._12_4_ * fVar105;
            fVar107 = local_1060._16_4_;
            auVar29._16_4_ = auVar125._16_4_ * fVar107;
            fVar18 = local_1060._20_4_;
            auVar29._20_4_ = auVar125._20_4_ * fVar18;
            fVar20 = local_1060._24_4_;
            auVar29._24_4_ = auVar125._24_4_ * fVar20;
            auVar29._28_4_ = auVar125._28_4_;
            auVar63 = vfmsub231ps_fma(auVar29,local_10a0,auVar69);
            auVar30._4_4_ = (float)local_1480._4_4_ * auVar63._4_4_;
            auVar30._0_4_ = (float)local_1480._4_4_ * auVar63._0_4_;
            auVar30._8_4_ = (float)local_1480._4_4_ * auVar63._8_4_;
            auVar30._12_4_ = (float)local_1480._4_4_ * auVar63._12_4_;
            auVar30._16_4_ = (float)local_1480._4_4_ * 0.0;
            auVar30._20_4_ = (float)local_1480._4_4_ * 0.0;
            auVar30._24_4_ = (float)local_1480._4_4_ * 0.0;
            auVar30._28_4_ = auVar69._28_4_;
            auVar98 = vfmadd231ps_fma(auVar30,local_1500._0_32_,ZEXT1632(auVar98));
            auVar98 = vfmadd231ps_fma(ZEXT1632(auVar98),auVar122,ZEXT1632(auVar61));
            auVar22 = vsubps_avx(auVar58,auVar23);
            auVar78._0_4_ = auVar23._0_4_ + auVar58._0_4_;
            auVar78._4_4_ = auVar23._4_4_ + auVar58._4_4_;
            auVar78._8_4_ = auVar23._8_4_ + auVar58._8_4_;
            auVar78._12_4_ = auVar23._12_4_ + auVar58._12_4_;
            auVar78._16_4_ = auVar23._16_4_ + auVar58._16_4_;
            auVar78._20_4_ = auVar23._20_4_ + auVar58._20_4_;
            auVar78._24_4_ = auVar23._24_4_ + auVar58._24_4_;
            auVar78._28_4_ = auVar23._28_4_ + auVar58._28_4_;
            auVar23 = vsubps_avx(auVar76,auVar67);
            auVar102._0_4_ = auVar76._0_4_ + auVar67._0_4_;
            auVar102._4_4_ = auVar76._4_4_ + auVar67._4_4_;
            auVar102._8_4_ = auVar76._8_4_ + auVar67._8_4_;
            auVar102._12_4_ = auVar76._12_4_ + auVar67._12_4_;
            auVar102._16_4_ = auVar76._16_4_ + auVar67._16_4_;
            auVar102._20_4_ = auVar76._20_4_ + auVar67._20_4_;
            auVar102._24_4_ = auVar76._24_4_ + auVar67._24_4_;
            auVar102._28_4_ = auVar76._28_4_ + auVar67._28_4_;
            auVar67 = vsubps_avx(auVar80,auVar21);
            auVar64._0_4_ = auVar80._0_4_ + auVar21._0_4_;
            auVar64._4_4_ = auVar80._4_4_ + auVar21._4_4_;
            auVar64._8_4_ = auVar80._8_4_ + auVar21._8_4_;
            auVar64._12_4_ = auVar80._12_4_ + auVar21._12_4_;
            auVar64._16_4_ = auVar80._16_4_ + auVar21._16_4_;
            auVar64._20_4_ = auVar80._20_4_ + auVar21._20_4_;
            auVar64._24_4_ = auVar80._24_4_ + auVar21._24_4_;
            auVar64._28_4_ = auVar80._28_4_ + auVar21._28_4_;
            auVar113._0_4_ = auVar67._0_4_ * auVar102._0_4_;
            auVar113._4_4_ = auVar67._4_4_ * auVar102._4_4_;
            auVar113._8_4_ = auVar67._8_4_ * auVar102._8_4_;
            auVar113._12_4_ = auVar67._12_4_ * auVar102._12_4_;
            auVar113._16_4_ = auVar67._16_4_ * auVar102._16_4_;
            auVar113._20_4_ = auVar67._20_4_ * auVar102._20_4_;
            auVar113._24_4_ = auVar67._24_4_ * auVar102._24_4_;
            auVar113._28_4_ = 0;
            auVar63 = vfmsub231ps_fma(auVar113,auVar23,auVar64);
            auVar80._4_4_ = auVar64._4_4_ * auVar22._4_4_;
            auVar80._0_4_ = auVar64._0_4_ * auVar22._0_4_;
            auVar80._8_4_ = auVar64._8_4_ * auVar22._8_4_;
            auVar80._12_4_ = auVar64._12_4_ * auVar22._12_4_;
            auVar80._16_4_ = auVar64._16_4_ * auVar22._16_4_;
            auVar80._20_4_ = auVar64._20_4_ * auVar22._20_4_;
            auVar80._24_4_ = auVar64._24_4_ * auVar22._24_4_;
            auVar80._28_4_ = auVar64._28_4_;
            auVar61 = vfmsub231ps_fma(auVar80,auVar67,auVar78);
            auVar21._4_4_ = auVar23._4_4_ * auVar78._4_4_;
            auVar21._0_4_ = auVar23._0_4_ * auVar78._0_4_;
            auVar21._8_4_ = auVar23._8_4_ * auVar78._8_4_;
            auVar21._12_4_ = auVar23._12_4_ * auVar78._12_4_;
            auVar21._16_4_ = auVar23._16_4_ * auVar78._16_4_;
            auVar21._20_4_ = auVar23._20_4_ * auVar78._20_4_;
            auVar21._24_4_ = auVar23._24_4_ * auVar78._24_4_;
            auVar21._28_4_ = auVar78._28_4_;
            auVar92 = vfmsub231ps_fma(auVar21,auVar22,auVar102);
            local_1480._0_4_ = local_1480._4_4_;
            fStack_1478 = (float)local_1480._4_4_;
            fStack_1474 = (float)local_1480._4_4_;
            fStack_1470 = (float)local_1480._4_4_;
            fStack_146c = (float)local_1480._4_4_;
            fStack_1468 = (float)local_1480._4_4_;
            fStack_1464 = (float)local_1480._4_4_;
            auVar79._0_4_ = (float)local_1480._4_4_ * auVar92._0_4_;
            auVar79._4_4_ = (float)local_1480._4_4_ * auVar92._4_4_;
            auVar79._8_4_ = (float)local_1480._4_4_ * auVar92._8_4_;
            auVar79._12_4_ = (float)local_1480._4_4_ * auVar92._12_4_;
            auVar79._16_4_ = (float)local_1480._4_4_ * 0.0;
            auVar79._20_4_ = (float)local_1480._4_4_ * 0.0;
            auVar79._24_4_ = (float)local_1480._4_4_ * 0.0;
            auVar79._28_4_ = 0;
            auVar61 = vfmadd231ps_fma(auVar79,local_1500._0_32_,ZEXT1632(auVar61));
            auVar61 = vfmadd231ps_fma(ZEXT1632(auVar61),auVar122,ZEXT1632(auVar63));
            local_12c0 = ZEXT1632(CONCAT412(auVar61._12_4_ + local_1300._12_4_ + auVar98._12_4_,
                                            CONCAT48(auVar61._8_4_ +
                                                     local_1300._8_4_ + auVar98._8_4_,
                                                     CONCAT44(auVar61._4_4_ +
                                                              local_1300._4_4_ + auVar98._4_4_,
                                                              auVar61._0_4_ +
                                                              local_1300._0_4_ + auVar98._0_4_))));
            auVar65._8_4_ = 0x7fffffff;
            auVar65._0_8_ = 0x7fffffff7fffffff;
            auVar65._12_4_ = 0x7fffffff;
            auVar65._16_4_ = 0x7fffffff;
            auVar65._20_4_ = 0x7fffffff;
            auVar65._24_4_ = 0x7fffffff;
            auVar65._28_4_ = 0x7fffffff;
            local_14a0 = ZEXT1632(local_1300);
            auVar58 = vminps_avx(local_14a0,ZEXT1632(auVar98));
            auVar58 = vminps_avx(auVar58,ZEXT1632(auVar61));
            local_10e0 = vandps_avx(local_12c0,auVar65);
            fVar109 = local_10e0._0_4_ * 1.1920929e-07;
            fVar114 = local_10e0._4_4_ * 1.1920929e-07;
            auVar31._4_4_ = fVar114;
            auVar31._0_4_ = fVar109;
            fVar115 = local_10e0._8_4_ * 1.1920929e-07;
            auVar31._8_4_ = fVar115;
            fVar116 = local_10e0._12_4_ * 1.1920929e-07;
            auVar31._12_4_ = fVar116;
            fVar117 = local_10e0._16_4_ * 1.1920929e-07;
            auVar31._16_4_ = fVar117;
            fVar118 = local_10e0._20_4_ * 1.1920929e-07;
            auVar31._20_4_ = fVar118;
            fVar119 = local_10e0._24_4_ * 1.1920929e-07;
            auVar31._24_4_ = fVar119;
            auVar31._28_4_ = 0x34000000;
            auVar126._0_8_ = CONCAT44(fVar114,fVar109) ^ 0x8000000080000000;
            auVar126._8_4_ = -fVar115;
            auVar126._12_4_ = -fVar116;
            auVar126._16_4_ = -fVar117;
            auVar126._20_4_ = -fVar118;
            auVar126._24_4_ = -fVar119;
            auVar126._28_4_ = 0xb4000000;
            auVar58 = vcmpps_avx(auVar58,auVar126,5);
            local_10c0 = ZEXT1632(auVar98);
            auVar80 = vmaxps_avx(local_14a0,local_10c0);
            auVar76 = vmaxps_avx(auVar80,ZEXT1632(auVar61));
            auVar76 = vcmpps_avx(auVar76,auVar31,2);
            auVar76 = vorps_avx(auVar58,auVar76);
            if ((((((((auVar76 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar76 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar76 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar76 >> 0x7f,0) != '\0') ||
                  (auVar76 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar76 >> 0xbf,0) != '\0') ||
                (auVar76 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar76[0x1f] < '\0') {
              local_1100 = 0x80000000;
              uStack_10fc = 0x80000000;
              uStack_10f8 = 0x80000000;
              uStack_10f4 = 0x80000000;
              uStack_10f0 = 0x80000000;
              uStack_10ec = 0x80000000;
              uStack_10e8 = 0x80000000;
              uStack_10e4 = 0x80000000;
              auVar32._4_4_ = fVar83 * local_1020._4_4_;
              auVar32._0_4_ = fVar71 * local_1020._0_4_;
              auVar32._8_4_ = fVar103 * local_1020._8_4_;
              auVar32._12_4_ = fVar105 * local_1020._12_4_;
              auVar32._16_4_ = fVar107 * local_1020._16_4_;
              auVar32._20_4_ = fVar18 * local_1020._20_4_;
              auVar32._24_4_ = fVar20 * local_1020._24_4_;
              auVar32._28_4_ = auVar58._28_4_;
              auVar33._4_4_ = local_1040._4_4_ * fVar143;
              auVar33._0_4_ = local_1040._0_4_ * fVar141;
              auVar33._8_4_ = local_1040._8_4_ * fVar144;
              auVar33._12_4_ = local_1040._12_4_ * fVar145;
              auVar33._16_4_ = local_1040._16_4_ * fVar146;
              auVar33._20_4_ = local_1040._20_4_ * fVar147;
              auVar33._24_4_ = local_1040._24_4_ * fVar148;
              auVar33._28_4_ = auVar80._28_4_;
              auVar61 = vfmsub213ps_fma(local_1040,local_1080,auVar32);
              auVar34._4_4_ = fVar82 * auVar23._4_4_;
              auVar34._0_4_ = fVar81 * auVar23._0_4_;
              auVar34._8_4_ = fVar91 * auVar23._8_4_;
              auVar34._12_4_ = fVar104 * auVar23._12_4_;
              auVar34._16_4_ = fVar106 * auVar23._16_4_;
              auVar34._20_4_ = fVar108 * auVar23._20_4_;
              auVar34._24_4_ = fVar19 * auVar23._24_4_;
              auVar34._28_4_ = 0x34000000;
              auVar132._0_4_ = fVar141 * auVar67._0_4_;
              auVar132._4_4_ = fVar143 * auVar67._4_4_;
              auVar132._8_4_ = fVar144 * auVar67._8_4_;
              auVar132._12_4_ = fVar145 * auVar67._12_4_;
              auVar132._16_4_ = fVar146 * auVar67._16_4_;
              auVar132._20_4_ = fVar147 * auVar67._20_4_;
              auVar132._24_4_ = fVar148 * auVar67._24_4_;
              auVar132._28_4_ = 0;
              auVar63 = vfmsub213ps_fma(auVar67,local_1060,auVar34);
              auVar58 = vandps_avx(auVar32,auVar65);
              auVar80 = vandps_avx(auVar34,auVar65);
              auVar58 = vcmpps_avx(auVar58,auVar80,1);
              local_12a0 = vblendvps_avx(ZEXT1632(auVar63),ZEXT1632(auVar61),auVar58);
              auVar35._4_4_ = fVar83 * auVar22._4_4_;
              auVar35._0_4_ = fVar71 * auVar22._0_4_;
              auVar35._8_4_ = fVar103 * auVar22._8_4_;
              auVar35._12_4_ = fVar105 * auVar22._12_4_;
              auVar35._16_4_ = fVar107 * auVar22._16_4_;
              auVar35._20_4_ = fVar18 * auVar22._20_4_;
              auVar35._24_4_ = fVar20 * auVar22._24_4_;
              auVar35._28_4_ = auVar58._28_4_;
              auVar61 = vfmsub213ps_fma(auVar22,local_1080,auVar132);
              auVar36._4_4_ = local_1000._4_4_ * fVar82;
              auVar36._0_4_ = local_1000._0_4_ * fVar81;
              auVar36._8_4_ = local_1000._8_4_ * fVar91;
              auVar36._12_4_ = local_1000._12_4_ * fVar104;
              auVar36._16_4_ = local_1000._16_4_ * fVar106;
              auVar36._20_4_ = local_1000._20_4_ * fVar108;
              auVar36._24_4_ = local_1000._24_4_ * fVar19;
              auVar36._28_4_ = auVar80._28_4_;
              auVar63 = vfmsub213ps_fma(local_1020,local_10a0,auVar36);
              auVar58 = vandps_avx(auVar36,auVar65);
              auVar80 = vandps_avx(auVar132,auVar65);
              auVar58 = vcmpps_avx(auVar58,auVar80,1);
              local_1280 = vblendvps_avx(ZEXT1632(auVar61),ZEXT1632(auVar63),auVar58);
              auVar61 = vfmsub213ps_fma(local_1000,local_1060,auVar33);
              auVar63 = vfmsub213ps_fma(auVar23,local_10a0,auVar35);
              auVar58 = vandps_avx(auVar33,auVar65);
              auVar80 = vandps_avx(auVar35,auVar65);
              auVar80 = vcmpps_avx(auVar58,auVar80,1);
              local_1260 = vblendvps_avx(ZEXT1632(auVar63),ZEXT1632(auVar61),auVar80);
              auVar61 = vpackssdw_avx(auVar76._0_16_,auVar76._16_16_);
              fVar91 = local_1260._0_4_;
              fVar103 = local_1260._4_4_;
              auVar23._4_4_ = fVar103 * (float)local_1480._4_4_;
              auVar23._0_4_ = fVar91 * (float)local_1480._4_4_;
              fVar104 = local_1260._8_4_;
              auVar23._8_4_ = fVar104 * (float)local_1480._4_4_;
              fVar105 = local_1260._12_4_;
              auVar23._12_4_ = fVar105 * (float)local_1480._4_4_;
              fVar106 = local_1260._16_4_;
              auVar23._16_4_ = fVar106 * (float)local_1480._4_4_;
              fVar107 = local_1260._20_4_;
              auVar23._20_4_ = fVar107 * (float)local_1480._4_4_;
              fVar108 = local_1260._24_4_;
              auVar23._24_4_ = fVar108 * (float)local_1480._4_4_;
              auVar23._28_4_ = auVar76._28_4_;
              auVar63 = vfmadd213ps_fma(local_1500._0_32_,local_1280,auVar23);
              auVar63 = vfmadd213ps_fma(auVar122,local_12a0,ZEXT1632(auVar63));
              fVar71 = auVar63._0_4_ + auVar63._0_4_;
              fVar81 = auVar63._4_4_ + auVar63._4_4_;
              fVar82 = auVar63._8_4_ + auVar63._8_4_;
              fVar83 = auVar63._12_4_ + auVar63._12_4_;
              auVar80 = ZEXT1632(CONCAT412(fVar83,CONCAT48(fVar82,CONCAT44(fVar81,fVar71))));
              auVar37._4_4_ = fVar103 * fVar12;
              auVar37._0_4_ = fVar91 * fVar90;
              auVar37._8_4_ = fVar104 * fVar13;
              auVar37._12_4_ = fVar105 * fVar14;
              auVar37._16_4_ = fVar106 * fVar15;
              auVar37._20_4_ = fVar107 * fVar16;
              auVar37._24_4_ = fVar108 * fVar17;
              auVar37._28_4_ = auVar58._28_4_;
              auVar63 = vfmadd213ps_fma(local_13c0,local_1280,auVar37);
              auVar92 = vfmadd213ps_fma(local_1440,local_12a0,ZEXT1632(auVar63));
              auVar58 = vrcpps_avx(auVar80);
              auVar135._8_4_ = 0x3f800000;
              auVar135._0_8_ = 0x3f8000003f800000;
              auVar135._12_4_ = 0x3f800000;
              auVar135._16_4_ = 0x3f800000;
              auVar135._20_4_ = 0x3f800000;
              auVar135._24_4_ = 0x3f800000;
              auVar135._28_4_ = 0x3f800000;
              auVar63 = vfnmadd213ps_fma(auVar58,auVar80,auVar135);
              auVar63 = vfmadd132ps_fma(ZEXT1632(auVar63),auVar58,auVar58);
              _local_1480 = ZEXT1632(CONCAT412((auVar92._12_4_ + auVar92._12_4_) * auVar63._12_4_,
                                               CONCAT48((auVar92._8_4_ + auVar92._8_4_) *
                                                        auVar63._8_4_,
                                                        CONCAT44((auVar92._4_4_ + auVar92._4_4_) *
                                                                 auVar63._4_4_,
                                                                 (auVar92._0_4_ + auVar92._0_4_) *
                                                                 auVar63._0_4_))));
              uVar47 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
              auVar88._4_4_ = uVar47;
              auVar88._0_4_ = uVar47;
              auVar88._8_4_ = uVar47;
              auVar88._12_4_ = uVar47;
              auVar88._16_4_ = uVar47;
              auVar88._20_4_ = uVar47;
              auVar88._24_4_ = uVar47;
              auVar88._28_4_ = uVar47;
              auVar58 = vcmpps_avx(auVar88,_local_1480,2);
              fVar90 = (ray->super_RayK<1>).tfar;
              auVar127._4_4_ = fVar90;
              auVar127._0_4_ = fVar90;
              auVar127._8_4_ = fVar90;
              auVar127._12_4_ = fVar90;
              auVar127._16_4_ = fVar90;
              auVar127._20_4_ = fVar90;
              auVar127._24_4_ = fVar90;
              auVar127._28_4_ = fVar90;
              auVar76 = vcmpps_avx(_local_1480,auVar127,2);
              auVar58 = vandps_avx(auVar76,auVar58);
              auVar128._0_8_ = CONCAT44(fVar81,fVar71) ^ 0x8000000080000000;
              auVar128._8_4_ = -fVar82;
              auVar128._12_4_ = -fVar83;
              auVar128._16_4_ = 0x80000000;
              auVar128._20_4_ = 0x80000000;
              auVar128._24_4_ = 0x80000000;
              auVar128._28_4_ = 0x80000000;
              auVar76 = vcmpps_avx(auVar128,auVar80,4);
              auVar58 = vandps_avx(auVar58,auVar76);
              auVar63 = vpackssdw_avx(auVar58._0_16_,auVar58._16_16_);
              auVar61 = vpand_avx(auVar63,auVar61);
              local_1240 = vpmovsxwd_avx2(auVar61);
              if ((((((((local_1240 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (local_1240 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (local_1240 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(local_1240 >> 0x7f,0) != '\0') ||
                    (local_1240 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(local_1240 >> 0xbf,0) != '\0') ||
                  (local_1240 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  local_1240[0x1f] < '\0') {
                uStack_12f0 = 0;
                uStack_12ec = 0;
                uStack_12e8 = 0;
                uStack_12e4 = 0;
                local_12e0 = local_10c0;
                auVar58 = vrcpps_avx(local_12c0);
                auVar129._8_4_ = 0x3f800000;
                auVar129._0_8_ = 0x3f8000003f800000;
                auVar129._12_4_ = 0x3f800000;
                auVar129._16_4_ = 0x3f800000;
                auVar129._20_4_ = 0x3f800000;
                auVar129._24_4_ = 0x3f800000;
                auVar129._28_4_ = 0x3f800000;
                auVar63 = vfnmadd213ps_fma(local_12c0,auVar58,auVar129);
                auVar63 = vfmadd132ps_fma(ZEXT1632(auVar63),auVar58,auVar58);
                auVar89._8_4_ = 0x219392ef;
                auVar89._0_8_ = 0x219392ef219392ef;
                auVar89._12_4_ = 0x219392ef;
                auVar89._16_4_ = 0x219392ef;
                auVar89._20_4_ = 0x219392ef;
                auVar89._24_4_ = 0x219392ef;
                auVar89._28_4_ = 0x219392ef;
                auVar58 = vcmpps_avx(local_10e0,auVar89,5);
                auVar58 = vandps_avx(auVar58,ZEXT1632(auVar63));
                local_11e0 = _local_1480;
                local_1160 = local_1120;
                auVar38._4_4_ = local_1300._4_4_ * auVar58._4_4_;
                auVar38._0_4_ = local_1300._0_4_ * auVar58._0_4_;
                auVar38._8_4_ = local_1300._8_4_ * auVar58._8_4_;
                auVar38._12_4_ = local_1300._12_4_ * auVar58._12_4_;
                auVar38._16_4_ = auVar58._16_4_ * 0.0;
                auVar38._20_4_ = auVar58._20_4_ * 0.0;
                auVar38._24_4_ = auVar58._24_4_ * 0.0;
                auVar38._28_4_ = 0;
                auVar76 = vminps_avx(auVar38,auVar129);
                auVar39._4_4_ = auVar98._4_4_ * auVar58._4_4_;
                auVar39._0_4_ = auVar98._0_4_ * auVar58._0_4_;
                auVar39._8_4_ = auVar98._8_4_ * auVar58._8_4_;
                auVar39._12_4_ = auVar98._12_4_ * auVar58._12_4_;
                auVar39._16_4_ = auVar58._16_4_ * 0.0;
                auVar39._20_4_ = auVar58._20_4_ * 0.0;
                auVar39._24_4_ = auVar58._24_4_ * 0.0;
                auVar39._28_4_ = 0;
                auVar58 = vminps_avx(auVar39,auVar129);
                auVar80 = vsubps_avx(auVar129,auVar76);
                local_1200 = vblendvps_avx(auVar58,auVar80,local_1120);
                auVar58 = vsubps_avx(auVar129,auVar58);
                local_1220 = vblendvps_avx(auVar76,auVar58,local_1120);
                local_11c0[0] = local_12a0._0_4_ * (float)local_1140._0_4_;
                local_11c0[1] = local_12a0._4_4_ * (float)local_1140._4_4_;
                local_11c0[2] = local_12a0._8_4_ * fStack_1138;
                local_11c0[3] = local_12a0._12_4_ * fStack_1134;
                fStack_11b0 = local_12a0._16_4_ * fStack_1130;
                fStack_11ac = local_12a0._20_4_ * fStack_112c;
                fStack_11a8 = local_12a0._24_4_ * fStack_1128;
                uStack_11a4 = local_1220._28_4_;
                local_11a0[0] = (float)local_1140._0_4_ * local_1280._0_4_;
                local_11a0[1] = (float)local_1140._4_4_ * local_1280._4_4_;
                local_11a0[2] = fStack_1138 * local_1280._8_4_;
                local_11a0[3] = fStack_1134 * local_1280._12_4_;
                fStack_1190 = fStack_1130 * local_1280._16_4_;
                fStack_118c = fStack_112c * local_1280._20_4_;
                fStack_1188 = fStack_1128 * local_1280._24_4_;
                uStack_1184 = auVar58._28_4_;
                auVar58 = vpmovzxwd_avx2(auVar61);
                auVar58 = vpslld_avx2(auVar58,0x1f);
                auVar70._8_4_ = 0x7f800000;
                auVar70._0_8_ = 0x7f8000007f800000;
                auVar70._12_4_ = 0x7f800000;
                auVar70._16_4_ = 0x7f800000;
                auVar70._20_4_ = 0x7f800000;
                auVar70._24_4_ = 0x7f800000;
                auVar70._28_4_ = 0x7f800000;
                auVar58 = vblendvps_avx(auVar70,_local_1480,auVar58);
                local_1180[0] = (float)local_1140._0_4_ * fVar91;
                local_1180[1] = (float)local_1140._4_4_ * fVar103;
                local_1180[2] = fStack_1138 * fVar104;
                local_1180[3] = fStack_1134 * fVar105;
                fStack_1170 = fStack_1130 * fVar106;
                fStack_116c = fStack_112c * fVar107;
                fStack_1168 = fStack_1128 * fVar108;
                uStack_1164 = uStack_1124;
                auVar76 = vshufps_avx(auVar58,auVar58,0xb1);
                auVar76 = vminps_avx(auVar58,auVar76);
                auVar80 = vshufpd_avx(auVar76,auVar76,5);
                auVar76 = vminps_avx(auVar76,auVar80);
                auVar80 = vpermpd_avx2(auVar76,0x4e);
                auVar76 = vminps_avx(auVar76,auVar80);
                auVar58 = vcmpps_avx(auVar58,auVar76,0);
                auVar98 = vpackssdw_avx(auVar58._0_16_,auVar58._16_16_);
                auVar98 = vpand_avx(auVar98,auVar61);
                local_14a0 = *(undefined1 (*) [32])&(ray->super_RayK<1>).tfar;
                local_13e0 = local_1240;
                auVar58 = vpmovzxwd_avx2(auVar98);
                auVar58 = vpslld_avx2(auVar58,0x1f);
                if ((((((((auVar58 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (auVar58 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar58 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(auVar58 >> 0x7f,0) == '\0') &&
                      (auVar58 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(auVar58 >> 0xbf,0) == '\0') &&
                    (auVar58 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < auVar58[0x1f]) {
                  auVar58 = local_1240;
                }
                uVar47 = vextractps_avx(local_14a0._0_16_,1);
                local_1500._0_4_ = uVar47;
                uVar41 = vmovmskps_avx(auVar58);
                uVar48 = 0;
                for (; (uVar41 & 1) == 0; uVar41 = uVar41 >> 1 | 0x80000000) {
                  uVar48 = uVar48 + 1;
                }
                do {
                  uVar44 = CONCAT44(0,uVar48);
                  uVar48 = *(uint *)((long)&local_fc0 + uVar44 * 4);
                  pGVar11 = (local_1450->geometries).items[uVar48].ptr;
                  if ((pGVar11->mask & local_1500._0_4_) == 0) {
                    *(undefined4 *)(local_13e0 + uVar44 * 4) = 0;
                    uVar48 = local_1500._0_4_;
                  }
                  else {
                    local_1500._0_8_ = context->args;
                    if (context->args->filter == (RTCFilterFunctionN)0x0) {
                      pRVar45 = context->user;
                      if (pGVar11->intersectionFilterN == (RTCFilterFunctionN)0x0) {
                        fVar90 = *(float *)(local_1220 + uVar44 * 4);
                        fVar12 = *(float *)(local_1200 + uVar44 * 4);
                        (ray->super_RayK<1>).tfar = *(float *)(local_11e0 + uVar44 * 4);
                        (ray->Ng).field_0.field_0.x = local_11c0[uVar44];
                        (ray->Ng).field_0.field_0.y = local_11a0[uVar44];
                        (ray->Ng).field_0.field_0.z = local_1180[uVar44];
                        ray->u = fVar90;
                        ray->v = fVar12;
                        ray->primID = *(uint *)((long)&local_1320 + uVar44 * 4);
                        ray->geomID = uVar48;
                        ray->instID[0] = pRVar45->instID[0];
                        ray->instPrimID[0] = pRVar45->instPrimID[0];
                        break;
                      }
                    }
                    else {
                      pRVar45 = context->user;
                    }
                    local_1410 = local_11c0[uVar44];
                    local_140c = local_11a0[uVar44];
                    local_1408 = local_1180[uVar44];
                    local_1404 = *(undefined4 *)(local_1220 + uVar44 * 4);
                    local_1400 = *(undefined4 *)(local_1200 + uVar44 * 4);
                    local_13fc = *(undefined4 *)((long)&local_1320 + uVar44 * 4);
                    local_13f8 = uVar48;
                    local_13f4 = pRVar45->instID[0];
                    local_13f0 = pRVar45->instPrimID[0];
                    (ray->super_RayK<1>).tfar = *(float *)(local_11e0 + uVar44 * 4);
                    local_1504 = -1;
                    local_14d0.valid = &local_1504;
                    local_14d0.geometryUserPtr = pGVar11->userPtr;
                    local_14d0.context = pRVar45;
                    local_14d0.ray = (RTCRayN *)ray;
                    local_14d0.hit = (RTCHitN *)&local_1410;
                    local_14d0.N = 1;
                    local_1440._0_8_ = pGVar11;
                    local_13c0._0_8_ = uVar44;
                    if (pGVar11->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01937c9a:
                      if ((*(code **)(local_1500._0_8_ + 0x10) != (code *)0x0) &&
                         (((*(byte *)local_1500._0_8_ & 2) != 0 ||
                          ((*(byte *)(local_1440._0_8_ + 0x3e) & 0x40) != 0)))) {
                        (**(code **)(local_1500._0_8_ + 0x10))(&local_14d0);
                        uVar44 = local_13c0._0_8_;
                        if (*local_14d0.valid == 0) goto LAB_01937d59;
                      }
                      (((Vec3f *)((long)local_14d0.ray + 0x30))->field_0).field_0.x =
                           *(float *)local_14d0.hit;
                      (((Vec3f *)((long)local_14d0.ray + 0x30))->field_0).field_0.y =
                           *(float *)(local_14d0.hit + 4);
                      (((Vec3f *)((long)local_14d0.ray + 0x30))->field_0).field_0.z =
                           *(float *)(local_14d0.hit + 8);
                      *(float *)((long)local_14d0.ray + 0x3c) = *(float *)(local_14d0.hit + 0xc);
                      *(float *)((long)local_14d0.ray + 0x40) = *(float *)(local_14d0.hit + 0x10);
                      *(float *)((long)local_14d0.ray + 0x44) = *(float *)(local_14d0.hit + 0x14);
                      *(float *)((long)local_14d0.ray + 0x48) = *(float *)(local_14d0.hit + 0x18);
                      *(float *)((long)local_14d0.ray + 0x4c) = *(float *)(local_14d0.hit + 0x1c);
                      *(float *)((long)local_14d0.ray + 0x50) = *(float *)(local_14d0.hit + 0x20);
                    }
                    else {
                      (*pGVar11->intersectionFilterN)(&local_14d0);
                      uVar44 = local_13c0._0_8_;
                      if (*local_14d0.valid != 0) goto LAB_01937c9a;
LAB_01937d59:
                      (ray->super_RayK<1>).tfar = (float)local_14a0._0_4_;
                      uVar44 = local_13c0._0_8_;
                    }
                    fVar90 = (ray->super_RayK<1>).tfar;
                    auVar59._4_4_ = fVar90;
                    auVar59._0_4_ = fVar90;
                    auVar59._8_4_ = fVar90;
                    auVar59._12_4_ = fVar90;
                    auVar59._16_4_ = fVar90;
                    auVar59._20_4_ = fVar90;
                    auVar59._24_4_ = fVar90;
                    auVar59._28_4_ = fVar90;
                    *(undefined4 *)(local_13e0 + uVar44 * 4) = 0;
                    auVar58 = vcmpps_avx(_local_1480,auVar59,2);
                    local_13e0 = vandps_avx(auVar58,local_13e0);
                    local_14a0 = ZEXT432((uint)(ray->super_RayK<1>).tfar);
                    uVar48 = (ray->super_RayK<1>).mask;
                  }
                  if ((((((((local_13e0 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                           (local_13e0 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (local_13e0 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         SUB321(local_13e0 >> 0x7f,0) == '\0') &&
                        (local_13e0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                       SUB321(local_13e0 >> 0xbf,0) == '\0') &&
                      (local_13e0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                      -1 < local_13e0[0x1f]) break;
                  local_1500._0_4_ = uVar48;
                  BVHNIntersector1<4,1048576,false,embree::avx2::ArrayIntersector1<embree::avx2::QuadMiIntersector1Pluecker<4,true>>>
                  ::intersect(&local_14d0);
                  uVar48 = (uint)local_14d0.valid;
                } while( true );
              }
            }
            lVar54 = lVar54 + 1;
          } while (lVar54 != local_1458);
        }
        fVar90 = (ray->super_RayK<1>).tfar;
        auVar60 = ZEXT1664(CONCAT412(fVar90,CONCAT48(fVar90,CONCAT44(fVar90,fVar90))));
        auVar133 = ZEXT1664(local_1330);
        auVar136 = ZEXT1664(local_1340);
        auVar137 = ZEXT1664(local_1350);
        auVar138 = ZEXT1664(local_1360);
        auVar140 = ZEXT1664(local_1370);
        auVar142 = ZEXT1664(local_1380);
        auVar150 = ZEXT1664(local_1390);
      }
    } while (pauVar42 != (undefined1 (*) [16])&local_fa0);
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }